

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcNtk.c
# Opt level: O2

void Wlc_NtkPrintNodes(Wlc_Ntk_t *p,int Type)

{
  uint uVar1;
  uint uVar2;
  char *pcVar3;
  Wlc_Obj_t *pObj;
  Wlc_Obj_t *pWVar4;
  int *piVar5;
  char *pcVar6;
  uint Id;
  uint uVar7;
  
  pcVar3 = Wlc_Names[Type];
  printf("Operation %s\n");
  uVar7 = 0;
  for (Id = 1; (int)Id < p->iObj; Id = Id + 1) {
    pObj = Wlc_NtkObj(p,Id);
    if ((*(ushort *)pObj & 0x3f) == Type) {
      printf("%8d  :",(ulong)uVar7);
      printf("%8d  :  ",(ulong)Id);
      pcVar6 = "s";
      if ((undefined1  [24])((undefined1  [24])*pObj & (undefined1  [24])0x40) ==
          (undefined1  [24])0x0) {
        pcVar6 = " ";
      }
      printf("%3d%s = ",(ulong)((pObj->End - pObj->Beg) + 1),pcVar6);
      pWVar4 = Wlc_ObjFanin0(p,pObj);
      uVar1 = pWVar4->End;
      uVar2 = pWVar4->Beg;
      pWVar4 = Wlc_ObjFanin0(p,pObj);
      pcVar6 = "s";
      if ((undefined1  [24])((undefined1  [24])*pWVar4 & (undefined1  [24])0x40) ==
          (undefined1  [24])0x0) {
        pcVar6 = " ";
      }
      printf("%3d%s  %s ",(ulong)((uVar1 - uVar2) + 1),pcVar6,pcVar3);
      pWVar4 = Wlc_ObjFanin1(p,pObj);
      uVar1 = pWVar4->End;
      uVar2 = pWVar4->Beg;
      pWVar4 = Wlc_ObjFanin1(p,pObj);
      pcVar6 = "s";
      if ((undefined1  [24])((undefined1  [24])*pWVar4 & (undefined1  [24])0x40) ==
          (undefined1  [24])0x0) {
        pcVar6 = " ";
      }
      printf("%3d%s ",(ulong)((uVar1 - uVar2) + 1),pcVar6);
      printf(" :    ");
      pcVar6 = Wlc_ObjName(p,Id);
      printf("%-12s =  ",pcVar6);
      piVar5 = Wlc_ObjFanins(pObj);
      pcVar6 = Wlc_ObjName(p,*piVar5);
      printf("%-12s  %s  ",pcVar6,pcVar3);
      piVar5 = Wlc_ObjFanins(pObj);
      pcVar6 = Wlc_ObjName(p,piVar5[1]);
      printf("%-12s ",pcVar6);
      putchar(10);
      uVar7 = uVar7 + 1;
    }
  }
  return;
}

Assistant:

void Wlc_NtkPrintNodes( Wlc_Ntk_t * p, int Type )
{
    Wlc_Obj_t * pObj; 
    int i, Counter = 0;
    printf( "Operation %s\n", Wlc_Names[Type] );
    Wlc_NtkForEachObj( p, pObj, i )
    {
        if ( (int)pObj->Type != Type )
            continue;
        printf( "%8d  :",      Counter++ );
        printf( "%8d  :  ",    i );
        printf( "%3d%s = ",    Wlc_ObjRange(pObj),                   Wlc_ObjIsSigned(pObj) ? "s" : " " );
        printf( "%3d%s  %s ",  Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)), Wlc_ObjIsSigned(Wlc_ObjFanin0(p, pObj)) ? "s" : " ", Wlc_Names[Type] );
        printf( "%3d%s ",      Wlc_ObjRange(Wlc_ObjFanin1(p, pObj)), Wlc_ObjIsSigned(Wlc_ObjFanin1(p, pObj)) ? "s" : " " );
        printf( " :    " );
        printf( "%-12s =  ",   Wlc_ObjName(p, i) );
        printf( "%-12s  %s  ", Wlc_ObjName(p, Wlc_ObjFaninId0(pObj)), Wlc_Names[Type] );
        printf( "%-12s ",      Wlc_ObjName(p, Wlc_ObjFaninId1(pObj)) );
        printf( "\n" );
    }
}